

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

int __thiscall smf::MidiMessage::getControllerNumber(MidiMessage *this)

{
  bool bVar1;
  int output;
  MidiMessage *this_local;
  
  bVar1 = isController(this);
  if (bVar1) {
    this_local._4_4_ = getP1(this);
    if (-1 < (int)this_local._4_4_) {
      this_local._4_4_ = this_local._4_4_ & 0x7f;
    }
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

int MidiMessage::getControllerNumber(void) const {
  if (isController()) {
		int output = getP1();
		if (output < 0) {
			// -1 means no P1, although isController() is false in such a case.
			return output;
		} else {
			return 0x7f & output;
		}
	} else {
		return -1;
	}
}